

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::ParseDataObjectMeshMaterialList(XFileParser *this,Mesh *pMesh)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  size_type sVar5;
  reference __x;
  long lVar6;
  vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_> *this_00;
  reference pMaterial;
  Logger *this_01;
  Material local_1a8;
  undefined1 local_138 [8];
  Material material;
  string matName;
  string local_a0;
  undefined1 local_80 [8];
  string objectName;
  uint uStack_58;
  bool running;
  uint a;
  allocator<char> local_41;
  string local_40;
  uint local_1c;
  Mesh *pMStack_18;
  uint numMatIndices;
  Mesh *pMesh_local;
  XFileParser *this_local;
  
  pMStack_18 = pMesh;
  pMesh_local = (Mesh *)this;
  readHeadOfDataObject(this,(string *)0x0);
  ReadInt(this);
  local_1c = ReadInt(this);
  uVar2 = (ulong)local_1c;
  sVar3 = std::vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>::size
                    (&pMStack_18->mPosFaces);
  if ((uVar2 != sVar3) && (local_1c != 1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Per-Face material index count does not match face count.",
               &local_41);
    ThrowException(this,&local_40);
  }
  for (uStack_58 = 0; uStack_58 < local_1c; uStack_58 = uStack_58 + 1) {
    pvVar4 = &pMStack_18->mFaceMaterials;
    objectName.field_2._12_4_ = ReadInt(this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (pvVar4,(value_type_conflict1 *)(objectName.field_2._M_local_buf + 0xc));
  }
  if ((((this->mIsBinaryFormat & 1U) == 0) && (this->mP < this->mEnd)) && (*this->mP == ';')) {
    this->mP = this->mP + 1;
  }
  while( true ) {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&pMStack_18->mFaceMaterials);
    sVar5 = std::vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>::size
                      (&pMStack_18->mPosFaces);
    if (sVar5 <= sVar3) break;
    pvVar4 = &pMStack_18->mFaceMaterials;
    __x = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front
                    (&pMStack_18->mFaceMaterials);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar4,__x);
  }
  objectName.field_2._M_local_buf[0xb] = '\x01';
  while( true ) {
    if ((objectName.field_2._M_local_buf[0xb] & 1U) == 0) {
      return;
    }
    GetNextToken_abi_cxx11_((string *)local_80,this);
    lVar6 = std::__cxx11::string::size();
    if (lVar6 == 0) break;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80,"}");
    if (bVar1) {
      matName.field_2._8_4_ = 8;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_80,"{");
      if (bVar1) {
        GetNextToken_abi_cxx11_((string *)&material.sceneIndex,this);
        XFile::Material::Material((Material *)local_138);
        material.mName.field_2._M_local_buf[8] = '\x01';
        std::__cxx11::string::operator=((string *)local_138,(string *)&material.sceneIndex);
        std::vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>::push_back
                  (&pMStack_18->mMaterials,(value_type *)local_138);
        CheckForClosingBrace(this);
        XFile::Material::~Material((Material *)local_138);
        std::__cxx11::string::~string((string *)&material.sceneIndex);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_80,"Material");
        if (bVar1) {
          this_00 = &pMStack_18->mMaterials;
          XFile::Material::Material(&local_1a8);
          std::vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>::push_back
                    (this_00,&local_1a8);
          XFile::Material::~Material(&local_1a8);
          pMaterial = std::vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>
                      ::back(&pMStack_18->mMaterials);
          ParseDataObjectMaterial(this,pMaterial);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_80,";");
          if (!bVar1) {
            this_01 = DefaultLogger::get();
            Logger::warn(this_01,"Unknown data object in material list in x file");
            ParseUnknownDataObject(this);
          }
        }
      }
      matName.field_2._8_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_80);
    if (matName.field_2._8_4_ != 0) {
      return;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Unexpected end of file while parsing mesh material list.",
             (allocator<char> *)(matName.field_2._M_local_buf + 0xf));
  ThrowException(this,&local_a0);
}

Assistant:

void XFileParser::ParseDataObjectMeshMaterialList( Mesh* pMesh)
{
    readHeadOfDataObject();

    // read material count
    /*unsigned int numMaterials =*/ ReadInt();
    // read non triangulated face material index count
    unsigned int numMatIndices = ReadInt();

    // some models have a material index count of 1... to be able to read them we
    // replicate this single material index on every face
    if( numMatIndices != pMesh->mPosFaces.size() && numMatIndices != 1)
        ThrowException( "Per-Face material index count does not match face count.");

    // read per-face material indices
    for( unsigned int a = 0; a < numMatIndices; a++)
        pMesh->mFaceMaterials.push_back( ReadInt());

    // in version 03.02, the face indices end with two semicolons.
    // commented out version check, as version 03.03 exported from blender also has 2 semicolons
    if( !mIsBinaryFormat) // && MajorVersion == 3 && MinorVersion <= 2)
    {
        if(mP < mEnd && *mP == ';')
            ++mP;
    }

    // if there was only a single material index, replicate it on all faces
    while( pMesh->mFaceMaterials.size() < pMesh->mPosFaces.size())
        pMesh->mFaceMaterials.push_back( pMesh->mFaceMaterials.front());

    // read following data objects
    bool running = true;
    while ( running )
    {
        std::string objectName = GetNextToken();
        if( objectName.size() == 0)
            ThrowException( "Unexpected end of file while parsing mesh material list.");
        else
        if( objectName == "}")
            break; // material list finished
        else
        if( objectName == "{")
        {
            // template materials
            std::string matName = GetNextToken();
            Material material;
            material.mIsReference = true;
            material.mName = matName;
            pMesh->mMaterials.push_back( material);

            CheckForClosingBrace(); // skip }
        } else
        if( objectName == "Material")
        {
            pMesh->mMaterials.push_back( Material());
            ParseDataObjectMaterial( &pMesh->mMaterials.back());
        } else
        if( objectName == ";")
        {
            // ignore
        } else
        {
            ASSIMP_LOG_WARN("Unknown data object in material list in x file");
            ParseUnknownDataObject();
        }
    }
}